

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example-quadratic.cpp
# Opt level: O3

double foo(VectorXd *x,VectorXd *grad)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  double *pdVar5;
  double *pdVar6;
  long lVar7;
  ulong uVar8;
  undefined8 *puVar9;
  Index index;
  ulong uVar10;
  uint uVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  scalar_sum_op<double,_double> local_99;
  DenseStorage<double,__1,__1,_1,_0> local_98;
  Scalar local_80;
  CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_78;
  redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  local_50;
  
  lVar7 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  local_98.m_data = (double *)0x0;
  local_98.m_rows = 0;
  uVar10 = lVar7 << 0x20;
  uVar11 = (uint)lVar7;
  if ((int)uVar11 < 1) {
    pdVar6 = (double *)0x0;
  }
  else {
    pdVar6 = (double *)malloc(uVar10 >> 0x1d);
    auVar4 = _DAT_00106020;
    if (pdVar6 == (double *)0x0) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar9 = operator_delete;
      __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    lVar7 = (ulong)(uVar11 & 0x7fffffff) - 1;
    auVar13._8_4_ = (int)lVar7;
    auVar13._0_8_ = lVar7;
    auVar13._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar8 = 0;
    auVar13 = auVar13 ^ _DAT_00106020;
    auVar15 = _DAT_00106010;
    do {
      auVar16 = auVar15 ^ auVar4;
      if ((bool)(~(auVar16._4_4_ == auVar13._4_4_ && auVar13._0_4_ < auVar16._0_4_ ||
                  auVar13._4_4_ < auVar16._4_4_) & 1)) {
        pdVar6[uVar8] = (double)(int)uVar8;
      }
      if ((auVar16._12_4_ != auVar13._12_4_ || auVar16._8_4_ <= auVar13._8_4_) &&
          auVar16._12_4_ <= auVar13._12_4_) {
        pdVar6[uVar8 + 1] = (double)((int)uVar8 + 1);
      }
      uVar8 = uVar8 + 2;
      lVar7 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 2;
      auVar15._8_8_ = lVar7 + 2;
    } while ((uVar11 + 1 & 0xfffffffe) != uVar8);
  }
  local_78.m_xpr.m_rhs = (RhsNested)&local_98;
  local_78.m_xpr.m_lhs = x;
  local_98.m_data = pdVar6;
  local_98.m_rows = (long)(int)uVar11;
  if (uVar10 == 0) {
    local_80 = 0.0;
    uVar10 = 0;
  }
  else {
    local_50.
    super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
    .
    super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::IndexBased,_double>
    .m_d.argImpl.
    super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    .
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
    .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
         (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
         (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_50.
    super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
    .
    super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::internal::IndexBased,_double>
    .m_d.argImpl.
    super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
    .
    super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
    .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data =
         (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
         (evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)pdVar6;
    local_80 = Eigen::internal::
               redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>,3,0>
               ::
               run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
                         (&local_50,&local_99,&local_78);
    uVar10 = local_98.m_rows;
  }
  pdVar5 = local_98.m_data;
  pdVar6 = (x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  if ((grad->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
      uVar10) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&grad->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,uVar10,1);
    uVar10 = (grad->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
    ;
  }
  pdVar3 = (grad->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
  uVar8 = uVar10 - ((long)uVar10 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar10) {
    lVar7 = 0;
    do {
      pdVar1 = pdVar6 + lVar7;
      pdVar2 = pdVar5 + lVar7;
      dVar12 = *pdVar1 - *pdVar2;
      dVar14 = pdVar1[1] - pdVar2[1];
      pdVar1 = pdVar3 + lVar7;
      *pdVar1 = dVar12 + dVar12;
      pdVar1[1] = dVar14 + dVar14;
      lVar7 = lVar7 + 2;
    } while (lVar7 < (long)uVar8);
  }
  if ((long)uVar8 < (long)uVar10) {
    do {
      dVar12 = pdVar6[uVar8] - pdVar5[uVar8];
      pdVar3[uVar8] = dVar12 + dVar12;
      uVar8 = uVar8 + 1;
    } while (uVar10 != uVar8);
  }
  free(local_98.m_data);
  return local_80;
}

Assistant:

double foo(const VectorXd& x, VectorXd& grad)
{
    const int n = x.size();
    VectorXd d(n);
    for(int i = 0; i < n; i++)
        d[i] = i;

    double f = (x - d).squaredNorm();
    grad.noalias() = 2.0 * (x - d);
    return f;
}